

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void malloc_mutex_unlock(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  witness_t *in_RSI;
  long in_RDI;
  tsd_t *tsd;
  uint8_t state;
  witness_tsdn_t *pwStack_50;
  
  *(undefined1 *)&in_RSI[2].rank = 0;
  if (in_RDI == 0) {
    pwStack_50 = (witness_tsdn_t *)0x0;
  }
  else {
    pwStack_50 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_unlock(pwStack_50,in_RSI);
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI[1].comp);
  return;
}

Assistant:

static inline void
malloc_mutex_unlock(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	atomic_store_b(&mutex->locked, false, ATOMIC_RELAXED);
	witness_unlock(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
	if (isthreaded) {
		MALLOC_MUTEX_UNLOCK(mutex);
	}
}